

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall DCanvas::DrawTextureParms(DCanvas *this,FTexture *img,DrawParms *parms)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32 uVar6;
  int iVar7;
  uint uVar8;
  fixed_t fVar9;
  double dVar10;
  int local_bc;
  int zz;
  fixed_t xiscale_i;
  int x2_i;
  double xscale;
  double wi;
  double x2;
  double xiscale;
  fixed_t frac;
  double iyscale;
  double yscale;
  double centeryback;
  int stop4;
  double y0;
  double x0;
  BYTE *destorgsave;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_48;
  ESPSResult mode;
  FDynamicColormap *local_40;
  FDynamicColormap *colormap;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_30;
  uint local_2c;
  BYTE *pBStack_28;
  INTBOOL invertoverlay;
  BYTE *translation;
  DrawParms *parms_local;
  FTexture *img_local;
  DCanvas *this_local;
  
  pBStack_28 = (BYTE *)0x0;
  translation = (BYTE *)parms;
  parms_local = (DrawParms *)img;
  img_local = (FTexture *)this;
  if (parms->colorOverlay >> 0x18 == 0) {
    if (parms->remap != (FRemapTable *)0x0) {
      pBStack_28 = parms->remap->Remap;
    }
  }
  else {
    bVar3 = (parms->style).field_0.Flags;
    local_2c = bVar3 & 0x20;
    if (((parms->style).field_0.Flags & 0x10) != 0) {
      local_2c = (uint)(((bVar3 & 0x20) != 0 ^ 0xffU) & 1);
    }
    if (local_2c != 0) {
      PalEntry::PalEntry((PalEntry *)((long)&colormap + 4),parms->colorOverlay);
      local_30.field_0 =
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
           PalEntry::InverseColor((PalEntry *)((long)&colormap + 4));
      uVar6 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&local_30.field_0);
      *(uint32 *)(translation + 0x88) = uVar6;
    }
    PalEntry::PalEntry((PalEntry *)&mode,0xffffff);
    PalEntry::PalEntry((PalEntry *)&local_48.field_0,*(uint *)(translation + 0x88) & 0xffffff);
    local_40 = GetSpecialLights((PalEntry)mode,(PalEntry)local_48,0);
    pBStack_28 = local_40->Maps + (((*(uint *)(translation + 0x88) >> 0x18) << 5) / 0xff << 8);
  }
  if (pBStack_28 == (BYTE *)0x0) {
    swrenderer::drawerargs::dc_colormap = swrenderer::identitymap;
  }
  else {
    swrenderer::drawerargs::dc_colormap = pBStack_28;
  }
  swrenderer::fixedcolormap = swrenderer::drawerargs::dc_colormap;
  destorgsave._4_4_ =
       swrenderer::R_SetPatchStyle
                 (*(FRenderStyle *)(translation + 0xa8),*(float *)(translation + 0x78),0,
                  *(uint32_t *)(translation + 0x7c));
  uVar4 = swrenderer::drawerargs::dc_destorg;
  swrenderer::drawerargs::dc_destorg = GetBuffer((DCanvas *)screen);
  if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
    I_FatalError("Attempt to write to buffer of hardware canvas");
  }
  uVar5 = swrenderer::CenterY;
  y0 = *(double *)translation -
       (*(double *)(translation + 0x70) * *(double *)(translation + 0x20)) /
       *(double *)(translation + 0x10);
  if (destorgsave._4_4_ != DontDraw) {
    swrenderer::CenterY = 0.0;
    modf(*(double *)(translation + 8) -
         (*(double *)(translation + 0x68) * *(double *)(translation + 0x28)) /
         *(double *)(translation + 0x18),&swrenderer::sprtopscreen);
    dVar1 = *(double *)(translation + 0x28);
    iVar7 = FTexture::GetHeight((FTexture *)parms_local);
    swrenderer::spryscale = dVar1 / (double)iVar7;
    if (swrenderer::spryscale <= 0.0) {
      __assert_fail("spryscale > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0xcb,"virtual void DCanvas::DrawTextureParms(FTexture *, DrawParms &)");
    }
    swrenderer::sprflipvert = 0;
    swrenderer::drawerargs::dc_iscale = FloatToFixed(1.0 / swrenderer::spryscale);
    swrenderer::dc_texturemid =
         (((swrenderer::CenterY - 1.0) - swrenderer::sprtopscreen) *
         (double)swrenderer::drawerargs::dc_iscale) / 65536.0;
    xiscale._4_4_ = 0;
    iVar7 = FTexture::GetWidth((FTexture *)parms_local);
    x2 = (double)iVar7 / *(double *)(translation + 0x20);
    wi = y0 + *(double *)(translation + 0x20);
    if ((int)DrawTextureParms::bottomclipper[0] != *(int *)(translation + 0x54)) {
      uVar8 = GetWidth((DCanvas *)screen);
      fillshort(DrawTextureParms::bottomclipper,uVar8,(WORD)*(undefined4 *)(translation + 0x54));
    }
    if (*(int *)(translation + 0x58) == 0) {
      swrenderer::mceilingclip = (short *)swrenderer::zeroarray;
    }
    else {
      if ((int)DrawTextureParms::topclipper[0] != *(int *)(translation + 0x58)) {
        uVar8 = GetWidth((DCanvas *)screen);
        fillshort(DrawTextureParms::topclipper,uVar8,(WORD)*(undefined4 *)(translation + 0x58));
      }
      swrenderer::mceilingclip = DrawTextureParms::topclipper;
    }
    swrenderer::mfloorclip = DrawTextureParms::bottomclipper;
    if (*(int *)(translation + 0x90) != 0) {
      iVar7 = FTexture::GetWidth((FTexture *)parms_local);
      xiscale._4_4_ = iVar7 * 0x10000 + -1;
      x2 = -x2;
    }
    if ((0.0 < *(double *)(translation + 0x40)) ||
       (*(double *)(translation + 0x48) < *(double *)(translation + 0x10))) {
      dVar10 = MIN<double>(*(double *)(translation + 0x48),*(double *)(translation + 0x10));
      dVar1 = *(double *)(translation + 0x20);
      dVar2 = *(double *)(translation + 0x10);
      y0 = *(double *)(translation + 0x40) * (dVar1 / dVar2) + y0;
      fVar9 = FloatToFixed(*(double *)(translation + 0x40));
      xiscale._4_4_ = fVar9 + xiscale._4_4_;
      wi = wi - (*(double *)(translation + 0x10) - dVar10) * (dVar1 / dVar2);
    }
    if (y0 < (double)*(int *)(translation + 0x5c)) {
      fVar9 = FloatToFixed(((double)*(int *)(translation + 0x5c) - y0) * x2);
      xiscale._4_4_ = fVar9 + xiscale._4_4_;
      y0 = (double)*(int *)(translation + 0x5c);
    }
    if ((double)*(int *)(translation + 0x60) < wi) {
      wi = (double)*(int *)(translation + 0x60);
    }
    if ((*(double *)(translation + 0x28) <= 32.0 && *(double *)(translation + 0x28) != 32.0) ||
       (*(int *)(translation + 0x54) - *(int *)(translation + 0x58) < 0x20)) {
      destorgsave._4_4_ = DoDraw0;
    }
    swrenderer::drawerargs::dc_x = (uint)y0;
    uVar8 = (uint)wi;
    fVar9 = FloatToFixed(x2);
    if (destorgsave._4_4_ == DoDraw0) {
      centeryback._4_4_ = swrenderer::drawerargs::dc_x;
    }
    else {
      centeryback._4_4_ = uVar8 & 0xfffffffc;
    }
    if ((int)swrenderer::drawerargs::dc_x < (int)uVar8) {
      for (; (int)swrenderer::drawerargs::dc_x < (int)centeryback._4_4_ &&
             (swrenderer::drawerargs::dc_x & 3) != 0;
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1) {
        swrenderer::R_DrawMaskedColumn
                  ((FTexture *)parms_local,xiscale._4_4_,false,
                   (bool)((*(int *)(translation + 0xa0) != 0 ^ 0xffU) & 1));
        xiscale._4_4_ = fVar9 + xiscale._4_4_;
      }
      while ((int)swrenderer::drawerargs::dc_x < (int)centeryback._4_4_) {
        swrenderer::rt_initcols((uint8_t *)0x0);
        for (local_bc = 4; local_bc != 0; local_bc = local_bc + -1) {
          swrenderer::R_DrawMaskedColumn
                    ((FTexture *)parms_local,xiscale._4_4_,true,
                     (bool)((*(int *)(translation + 0xa0) != 0 ^ 0xffU) & 1));
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1;
          xiscale._4_4_ = fVar9 + xiscale._4_4_;
        }
        swrenderer::rt_draw4cols(swrenderer::drawerargs::dc_x - 4);
      }
      for (; (int)swrenderer::drawerargs::dc_x < (int)uVar8;
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1) {
        swrenderer::R_DrawMaskedColumn
                  ((FTexture *)parms_local,xiscale._4_4_,false,
                   (bool)((*(int *)(translation + 0xa0) != 0 ^ 0xffU) & 1));
        xiscale._4_4_ = fVar9 + xiscale._4_4_;
      }
    }
  }
  swrenderer::CenterY = (double)uVar5;
  swrenderer::R_FinishSetPatchStyle();
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar4;
  if ((ticdup != 0) && (menuactive == MENU_Off)) {
    NetUpdate();
  }
  return;
}

Assistant:

void DCanvas::DrawTextureParms(FTexture *img, DrawParms &parms)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	static short bottomclipper[MAXWIDTH], topclipper[MAXWIDTH];
	const BYTE *translation = NULL;

	if (APART(parms.colorOverlay) != 0)
	{
		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertoverlay = (parms.style.Flags & STYLEF_InvertOverlay);

		if (parms.style.Flags & STYLEF_InvertSource)
		{
			invertoverlay = !invertoverlay;
		}
		if (invertoverlay)
		{
			parms.colorOverlay = PalEntry(parms.colorOverlay).InverseColor();
		}
		// Note that this overrides DTA_Translation in software, but not in hardware.
		FDynamicColormap *colormap = GetSpecialLights(MAKERGB(255,255,255),
			parms.colorOverlay & MAKEARGB(0,255,255,255), 0);
		translation = &colormap->Maps[(APART(parms.colorOverlay)*NUMCOLORMAPS/255)*256];
	}
	else if (parms.remap != NULL)
	{
		translation = parms.remap->Remap;
	}

	if (translation != NULL)
	{
		dc_colormap = (lighttable_t *)translation;
	}
	else
	{
		dc_colormap = identitymap;
	}

	fixedcolormap = dc_colormap;
	ESPSResult mode = R_SetPatchStyle (parms.style, parms.Alpha, 0, parms.fillcolor);

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	double x0 = parms.x - parms.left * parms.destwidth / parms.texwidth;
	double y0 = parms.y - parms.top * parms.destheight / parms.texheight;

	if (mode != DontDraw)
	{
		int stop4;

		double centeryback = CenterY;
		CenterY = 0;

		// There is not enough precision in the drawing routines to keep the full
		// precision for y0. :(
		modf(y0, &sprtopscreen);

		double yscale = parms.destheight / img->GetHeight();
		double iyscale = 1 / yscale;

		spryscale = yscale;
		assert(spryscale > 0);

		sprflipvert = false;
		//dc_iscale = FLOAT2FIXED(iyscale);
		//dc_texturemid = (-y0) * iyscale;
		//dc_iscale = 0xffffffffu / (unsigned)spryscale;
		dc_iscale = FLOAT2FIXED(1 / spryscale);
		dc_texturemid = (CenterY - 1 - sprtopscreen) * dc_iscale / 65536;
		fixed_t frac = 0;
		double xiscale = img->GetWidth() / parms.destwidth;
		double x2 = x0 + parms.destwidth;

		if (bottomclipper[0] != parms.dclip)
		{
			fillshort(bottomclipper, screen->GetWidth(), (short)parms.dclip);
		}
		if (parms.uclip != 0)
		{
			if (topclipper[0] != parms.uclip)
			{
				fillshort(topclipper, screen->GetWidth(), (short)parms.uclip);
			}
			mceilingclip = topclipper;
		}
		else
		{
			mceilingclip = zeroarray;
		}
		mfloorclip = bottomclipper;

		if (parms.flipX)
		{
			frac = (img->GetWidth() << FRACBITS) - 1;
			xiscale = -xiscale;
		}

		if (parms.windowleft > 0 || parms.windowright < parms.texwidth)
		{
			double wi = MIN(parms.windowright, parms.texwidth);
			double xscale = parms.destwidth / parms.texwidth;
			x0 += parms.windowleft * xscale;
			frac += FLOAT2FIXED(parms.windowleft);
			x2 -= (parms.texwidth - wi) * xscale;
		}
		if (x0 < parms.lclip)
		{
			frac += FLOAT2FIXED((parms.lclip - x0) * xiscale);
			x0 = parms.lclip;
		}
		if (x2 > parms.rclip)
		{
			x2 = parms.rclip;
		}

		// Drawing short output ought to fit in the data cache well enough
		// if we draw one column at a time, so do that, since it's simpler.
		if (parms.destheight < 32 || (parms.dclip - parms.uclip) < 32)
		{
			mode = DoDraw0;
		}

		dc_x = int(x0);
		int x2_i = int(x2);
		fixed_t xiscale_i = FLOAT2FIXED(xiscale);

		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = dc_x;
		}
		else	 // DoDraw1`
		{
			// Up to four columns at a time
			stop4 = x2_i & ~3;
		}

		if (dc_x < x2_i)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					R_DrawMaskedColumn(img, frac, true, !parms.masked);
					dc_x++;
					frac += xiscale_i;
				}
				rt_draw4cols(dc_x - 4);
			}

			while (dc_x < x2_i)
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}
		}
		CenterY = centeryback;
	}
	R_FinishSetPatchStyle ();

	dc_destorg = destorgsave;

	if (ticdup != 0 && menuactive == MENU_Off)
	{
		NetUpdate();
	}
#endif
}